

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvbios.c
# Opt level: O0

uint8_t parse_memtm_mapping_entry_10(uint16_t pos,uint16_t len,uint16_t hdr_pos)

{
  uint8_t local_9;
  uint16_t hdr_pos_local;
  uint16_t len_local;
  uint16_t pos_local;
  
  if (len < 4) {
    printf("Unknown timing mapping entry length: %u\n",(ulong)len);
    local_9 = 0xff;
  }
  else {
    if (bios->data[(int)(pos + 1)] == 0xff) {
      printf(" Timing entry: none/boot\n");
    }
    else {
      printf(" Timing entry: %u\n",(ulong)bios->data[(int)(pos + 1)]);
    }
    if (((bios->power).bit)->version == '\x02') {
      printf(" DLL         : ");
      if ((bios->data[(int)(pos + 2)] & 0x40) == 0) {
        printf("enabled\n");
      }
      else {
        printf("disabled\n");
      }
      printf(" FBVDDQ      : ");
      if ((bios->data[(int)(pos + 4)] & 8) == 0) {
        printf("high\n");
      }
      else {
        printf("low\n");
      }
    }
    printf("\n");
    local_9 = bios->data[(int)(pos + 1)];
  }
  return local_9;
}

Assistant:

uint8_t parse_memtm_mapping_entry_10(uint16_t pos, uint16_t len, uint16_t hdr_pos)
{
	if (len < 4) {
		printf("Unknown timing mapping entry length: %u\n", len);
		return 0xff;
	}

	if (bios->data[pos+1] != 0xff) {
		printf(" Timing entry: %u\n", bios->data[pos+1]);
	} else {
		printf(" Timing entry: none/boot\n");
	}

	if (bios->power.bit->version == 2) {
		printf(" DLL         : ");
		if(bios->data[pos+2] & 0x40)
			printf("disabled\n");
		else
			printf("enabled\n");

		printf(" FBVDDQ      : ");
		if(bios->data[pos+4] & 0x8)
			printf("low\n");
		else
			printf("high\n");
	}

	printf("\n");

	return bios->data[pos+1];
}